

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

QHttpNetworkReply * __thiscall
QHttpNetworkConnectionPrivate::queueRequest
          (QHttpNetworkConnectionPrivate *this,QHttpNetworkRequest *request)

{
  bool bVar1;
  Priority PVar2;
  QHttpNetworkConnection *key;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar3;
  QHttpNetworkReplyPrivate *pQVar4;
  long *in_RSI;
  QHttpNetworkConnectionPrivate *in_RDI;
  long in_FS_OFFSET;
  HttpMessagePair *in_stack_00000020;
  QHttpNetworkConnectionPrivate *in_stack_00000028;
  QHttpNetworkConnection *q;
  HttpMessagePair pair;
  QHttpNetworkReply *reply;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff68;
  QHttpNetworkReply *in_stack_ffffffffffffff70;
  QHttpNetworkConnectionPrivate *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QHttpNetworkConnectionPrivate *this_00;
  QUrl local_18;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key = q_func(in_RDI);
  ppVar3 = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)operator_new(0x18);
  (**(code **)(*in_RSI + 0x10))(&local_18);
  QHttpNetworkReply::QHttpNetworkReply
            ((QHttpNetworkReply *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (QUrl *)in_stack_ffffffffffffff78,&in_stack_ffffffffffffff70->super_QObject);
  QUrl::~QUrl(&local_18);
  local_10 = ppVar3;
  QHttpNetworkReply::setRequest
            (in_stack_ffffffffffffff70,(QHttpNetworkRequest *)in_stack_ffffffffffffff68);
  QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2ed5e5);
  QPointer<QHttpNetworkConnection>::operator=
            ((QPointer<QHttpNetworkConnection> *)in_stack_ffffffffffffff70,
             (QHttpNetworkConnection *)in_stack_ffffffffffffff68);
  this_00 = (QHttpNetworkConnectionPrivate *)in_RDI->channels;
  QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2ed617);
  QPointer<QHttpNetworkConnectionChannel>::operator=
            ((QPointer<QHttpNetworkConnectionChannel> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair<QHttpNetworkReply_*&,_true>
            ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (QHttpNetworkRequest *)in_stack_ffffffffffffff78,
             (QHttpNetworkReply **)in_stack_ffffffffffffff70);
  bVar1 = QHttpNetworkRequest::isPreConnect((QHttpNetworkRequest *)0x2ed670);
  if (bVar1) {
    in_RDI->preConnectRequests = in_RDI->preConnectRequests + 1;
  }
  if ((in_RDI->connectionType == ConnectionTypeHTTP) ||
     ((((in_RDI->encrypt & 1U) == 0 && (in_RDI->connectionType == ConnectionTypeHTTP2)) &&
      ((in_RDI->channels->switchedToHttp2 & 1U) == 0)))) {
    PVar2 = QHttpNetworkRequest::priority((QHttpNetworkRequest *)0x2ed6d3);
    if (PVar2 == HighPriority) {
      QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::prepend
                ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 in_stack_ffffffffffffff70,(parameter_type)in_stack_ffffffffffffff68);
    }
    else if (PVar2 - NormalPriority < 2) {
      QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::prepend
                ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 in_stack_ffffffffffffff70,(parameter_type)in_stack_ffffffffffffff68);
    }
  }
  else {
    pQVar4 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2ed726);
    if ((pQVar4->requestIsPrepared & 1U) == 0) {
      prepareRequest(in_stack_00000028,in_stack_00000020);
    }
    in_stack_ffffffffffffff78 = (QHttpNetworkConnectionPrivate *)&in_RDI->channels->h2RequestsToSend
    ;
    QHttpNetworkRequest::priority((QHttpNetworkRequest *)0x2ed75f);
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::insert
              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,
               (int *)key,ppVar3);
  }
  if ((in_RDI->networkLayerState == Unknown) || (in_RDI->networkLayerState == HostLookupPending)) {
    startHostInfoLookup(in_stack_ffffffffffffff78);
  }
  else if ((in_RDI->networkLayerState == IPv4) || (in_RDI->networkLayerState == IPv6)) {
    _q_startNextRequest(this_00);
  }
  ppVar3 = local_10;
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::~pair
            ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2ed7d7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QHttpNetworkReply *)ppVar3;
}

Assistant:

QHttpNetworkReply* QHttpNetworkConnectionPrivate::queueRequest(const QHttpNetworkRequest &request)
{
    Q_Q(QHttpNetworkConnection);

    // The reply component of the pair is created initially.
    QHttpNetworkReply *reply = new QHttpNetworkReply(request.url());
    reply->setRequest(request);
    reply->d_func()->connection = q;
    reply->d_func()->connectionChannel = &channels[0]; // will have the correct one set later
    HttpMessagePair pair = std::pair(request, reply);

    if (request.isPreConnect())
        preConnectRequests++;

    if (connectionType == QHttpNetworkConnection::ConnectionTypeHTTP
        || (!encrypt && connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2 && !channels[0].switchedToHttp2)) {
        switch (request.priority()) {
        case QHttpNetworkRequest::HighPriority:
            highPriorityQueue.prepend(pair);
            break;
        case QHttpNetworkRequest::NormalPriority:
        case QHttpNetworkRequest::LowPriority:
            lowPriorityQueue.prepend(pair);
            break;
        }
    }
    else { // HTTP/2 ('h2' mode)
        if (!pair.second->d_func()->requestIsPrepared)
            prepareRequest(pair);
        channels[0].h2RequestsToSend.insert(request.priority(), pair);
    }

    // For Happy Eyeballs the networkLayerState is set to Unknown
    // until we have started the first connection attempt. So no
    // request will be started until we know if IPv4 or IPv6
    // should be used.
    if (networkLayerState == Unknown || networkLayerState == HostLookupPending) {
        startHostInfoLookup();
    } else if ( networkLayerState == IPv4 || networkLayerState == IPv6 ) {
        // this used to be called via invokeMethod and a QueuedConnection
        // It is the only place _q_startNextRequest is called directly without going
        // through the event loop using a QueuedConnection.
        // This is dangerous because of recursion that might occur when emitting
        // signals as DirectConnection from this code path. Therefore all signal
        // emissions that can come out from this code path need to
        // be QueuedConnection.
        // We are currently trying to fine-tune this.
        _q_startNextRequest();
    }
    return reply;
}